

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextcursor.cpp
# Opt level: O3

void getText(QString *text,QTextDocumentPrivate *priv,QString *docText,int pos,int end)

{
  QTextFragmentData *pQVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  char16_t *pcVar6;
  FragmentMap *this;
  long in_FS_OFFSET;
  undefined1 local_48 [16];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (pos < end) {
    this = &priv->fragments;
    do {
      local_48._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_48._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      uVar3 = QFragmentMapData<QTextFragmentData>::findNode(&this->data,pos,0);
      local_48._8_4_ = uVar3;
      pQVar1 = (this->data).field_0.fragments;
      local_48._0_8_ = this;
      iVar4 = QFragmentMap<QTextFragmentData>::ConstIterator::position((ConstIterator *)local_48);
      uVar2 = pos - iVar4;
      if (pos - iVar4 < 1) {
        uVar2 = 0;
      }
      iVar5 = pQVar1[uVar3].super_QFragment<1>.size_array[0] - uVar2;
      iVar4 = end - pos;
      if (iVar5 < end - pos) {
        iVar4 = iVar5;
      }
      pcVar6 = (docText->d).ptr;
      if (pcVar6 == (char16_t *)0x0) {
        pcVar6 = (char16_t *)&QString::_empty;
      }
      QString::append((QChar *)text,
                      (longlong)(pcVar6 + (long)pQVar1[uVar3].stringPosition + (ulong)uVar2));
      pos = iVar4 + pos;
    } while (pos < end);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void getText(QString &text, QTextDocumentPrivate *priv, const QString &docText, int pos, int end)
{
    while (pos < end) {
        QTextDocumentPrivate::FragmentIterator fragIt = priv->find(pos);
        const QTextFragmentData * const frag = fragIt.value();

        const int offsetInFragment = qMax(0, pos - fragIt.position());
        const int len = qMin(int(frag->size_array[0] - offsetInFragment), end - pos);

        text += QStringView(docText.constData() + frag->stringPosition + offsetInFragment, len);
        pos += len;
    }
}